

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  ImGuiTable *pIVar2;
  long lVar3;
  long lVar4;
  ImGuiContext *g;
  
  uVar1 = (ctx->Tables).Map.Data.Size;
  for (lVar3 = 0; (ulong)uVar1 << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    pIVar2 = (ctx->Tables).Buf.Data;
    lVar4 = (long)*(int *)((long)&((ctx->Tables).Map.Data.Data)->field_1 + lVar3);
    if (pIVar2 != (ImGuiTable *)0x0 && lVar4 != -1) {
      pIVar2[lVar4].SettingsOffset = -1;
    }
  }
  ImVector<char>::clear(&(ctx->SettingsTables).Buf);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}